

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<long,_long>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<long,_long> *this)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  unsigned_long uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  
  bVar11 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      plVar2 = &this->min_max_diff;
      bVar3 = TrySubtractOperator::Operation<long,long,long>(this->maximum,this->minimum,plVar2);
      this->can_do_for = bVar3;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        lVar1 = this->minimum_delta;
        if ((this->maximum_delta == lVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 0x14;
          return true;
        }
        if (this->min_max_delta_diff == 0) {
          bVar7 = 0;
        }
        else {
          bVar9 = 0;
          uVar8 = this->min_max_delta_diff;
          do {
            bVar9 = bVar9 + 1;
            bVar3 = 1 < uVar8;
            uVar8 = (long)uVar8 >> 1;
          } while (bVar3);
          bVar7 = 0x40;
          if (bVar9 < 0x39) {
            bVar7 = bVar9;
          }
        }
        uVar8 = *plVar2;
        if (uVar8 == 0) {
          bVar6 = 0;
        }
        else {
          uVar10 = -uVar8;
          if (0 < (long)uVar8) {
            uVar10 = uVar8;
          }
          bVar9 = 0;
          do {
            bVar5 = bVar9;
            bVar9 = bVar5 + 1;
            bVar3 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar3);
          bVar6 = 0x40;
          if (bVar9 < 0x38) {
            bVar6 = bVar5 + 2;
          }
        }
        bVar3 = this->mode != FOR;
        if (bVar3 && bVar7 < bVar6) {
          if (this->compression_buffer_idx != 0) {
            uVar8 = 0;
            do {
              this->delta_buffer[uVar8] = this->delta_buffer[uVar8] - lVar1;
              uVar8 = uVar8 + 1;
            } while (uVar8 < this->compression_buffer_idx);
          }
          this->total_size = this->total_size + 0x18;
          uVar8 = this->compression_buffer_idx;
          if ((uVar8 & 0x1f) != 0) {
            uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar8 & 0x1f);
            uVar8 = (uVar8 - uVar4) + 0x20;
          }
          this->total_size = this->total_size + (bVar7 * uVar8 >> 3);
          if (bVar3 && bVar7 < bVar6) {
            return true;
          }
        }
      }
      if (this->can_do_for == true) {
        if (*plVar2 == 0) {
          uVar8 = 0;
        }
        else {
          bVar7 = 0;
          uVar8 = *plVar2;
          do {
            bVar7 = bVar7 + 1;
            bVar3 = 1 < uVar8;
            uVar8 = (long)uVar8 >> 1;
          } while (bVar3);
          bVar9 = 0x40;
          if (bVar7 < 0x39) {
            bVar9 = bVar7;
          }
          uVar8 = (ulong)bVar9;
        }
        if (this->compression_buffer_idx != 0) {
          plVar2 = this->compression_buffer;
          lVar1 = this->minimum;
          uVar10 = 0;
          do {
            plVar2[uVar10] = plVar2[uVar10] - lVar1;
            uVar10 = uVar10 + 1;
          } while (uVar10 < this->compression_buffer_idx);
        }
        uVar10 = this->compression_buffer_idx;
        if ((uVar10 & 0x1f) != 0) {
          uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
          uVar10 = (uVar10 - uVar4) + 0x20;
        }
        this->total_size = this->total_size + (uVar10 * uVar8 >> 3) + 0x10;
      }
      else {
        bVar11 = false;
      }
    }
    else {
      this->total_size = this->total_size + 0xc;
    }
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}